

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_31::WebSocketImpl::queuePong(WebSocketImpl *this,Array<unsigned_char> *payload)

{
  bool bVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Disposer *pDVar5;
  AsyncIoStream *pAVar6;
  PromiseNode *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uchar *puVar10;
  TransformPromiseNodeBase *this_00;
  Own<kj::_::PromiseNode> *dependencyParam;
  Own<kj::_::ChainPromiseNode> OVar11;
  Promise<void> PVar12;
  undefined1 local_88 [32];
  Own<kj::_::PromiseNode> local_68;
  uchar *local_58;
  uchar *puStack_50;
  ArrayDisposer *local_48;
  Disposer *local_40;
  PromiseNode *local_38;
  
  if (this->currentlySending == true) {
    if ((this->queuedPong).ptr.isSet == true) {
      (this->queuedPong).ptr.isSet = false;
      puVar2 = (this->queuedPong).ptr.field_1.value.ptr;
      if (puVar2 != (uchar *)0x0) {
        sVar3 = (this->queuedPong).ptr.field_1.value.size_;
        (this->queuedPong).ptr.field_1.value.ptr = (uchar *)0x0;
        (this->queuedPong).ptr.field_1.value.size_ = 0;
        pAVar4 = (this->queuedPong).ptr.field_1.value.disposer;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
      }
    }
    (this->queuedPong).ptr.field_1.value.ptr = payload->ptr;
    (this->queuedPong).ptr.field_1.value.size_ = payload->size_;
    (this->queuedPong).ptr.field_1.value.disposer = payload->disposer;
    payload->ptr = (uchar *)0x0;
    payload->size_ = 0;
    (this->queuedPong).ptr.isSet = true;
  }
  else {
    bVar1 = (this->sendingPong).ptr.isSet;
    dependencyParam = (Own<kj::_::PromiseNode> *)0x0;
    if (bVar1 != false) {
      dependencyParam = (Own<kj::_::PromiseNode> *)&(this->sendingPong).ptr.field_1;
    }
    if (bVar1 == true) {
      pDVar5 = (Disposer *)payload->ptr;
      pAVar6 = (AsyncIoStream *)payload->size_;
      pAVar4 = payload->disposer;
      payload->ptr = (uchar *)0x0;
      payload->size_ = 0;
      local_88._0_8_ = this;
      local_88._8_8_ = pDVar5;
      local_88._16_8_ = pAVar6;
      local_88._24_8_ = pAVar4;
      this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,dependencyParam,
                 CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2467:58),_kj::Array<unsigned_char>_>
                 ::operator()<>);
      (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f790;
      this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
      this_00[1].dependency.disposer = pDVar5;
      this_00[1].dependency.ptr = (PromiseNode *)pAVar6;
      this_00[1].continuationTracePtr = pAVar4;
      local_88._8_8_ = (Disposer *)0x0;
      local_88._16_8_ = (AsyncIoStream *)0x0;
      local_68.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::queuePong(kj::Array<unsigned_char>)::{lambda(kj::Array<unsigned_char>)#1},kj::Array<unsigned_char>>,kj::_::PropagateException>>
            ::instance;
      local_68.ptr = (PromiseNode *)this_00;
      OVar11 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_40,&local_68);
      pPVar7 = local_68.ptr;
      if ((TransformPromiseNodeBase *)local_68.ptr != (TransformPromiseNodeBase *)0x0) {
        local_68.ptr = (PromiseNode *)0x0;
        (**(local_68.disposer)->_vptr_Disposer)
                  (local_68.disposer,
                   (_func_int *)
                   ((long)&((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode +
                   (long)((PromiseNode *)&pPVar7->_vptr_PromiseNode)->_vptr_PromiseNode[-2]),
                   OVar11.ptr);
      }
      if ((this->sendingPong).ptr.isSet == true) {
        (this->sendingPong).ptr.isSet = false;
        pPVar7 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr;
        if (pPVar7 != (PromiseNode *)0x0) {
          (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
          pDVar5 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer;
          (**pDVar5->_vptr_Disposer)
                    (pDVar5,(_func_int *)
                            ((long)&pPVar7->_vptr_PromiseNode + (long)pPVar7->_vptr_PromiseNode[-2])
                    );
        }
      }
      uVar9 = local_88._16_8_;
      uVar8 = local_88._8_8_;
      (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer = local_40;
      (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = local_38;
      (this->sendingPong).ptr.isSet = true;
      if ((Disposer *)local_88._8_8_ != (Disposer *)0x0) {
        local_88._8_8_ = (Disposer *)0x0;
        local_88._16_8_ = (AsyncIoStream *)0x0;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,uVar8,1,uVar9,uVar9,0);
      }
    }
    else {
      local_58 = payload->ptr;
      puStack_50 = (uchar *)payload->size_;
      local_48 = payload->disposer;
      payload->ptr = (uchar *)0x0;
      payload->size_ = 0;
      PVar12 = sendPong((WebSocketImpl *)local_88,(Array<unsigned_char> *)this);
      if ((this->sendingPong).ptr.isSet == true) {
        (this->sendingPong).ptr.isSet = false;
        pPVar7 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr;
        if (pPVar7 != (PromiseNode *)0x0) {
          (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
          pDVar5 = (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer;
          (**pDVar5->_vptr_Disposer)
                    (pDVar5,(_func_int *)
                            ((long)&pPVar7->_vptr_PromiseNode + (long)pPVar7->_vptr_PromiseNode[-2])
                     ,PVar12.super_PromiseBase.node.ptr);
        }
      }
      puVar10 = puStack_50;
      puVar2 = local_58;
      (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.disposer =
           (Disposer *)local_88._0_8_;
      (this->sendingPong).ptr.field_1.value.super_PromiseBase.node.ptr =
           (PromiseNode *)local_88._8_8_;
      local_88._8_8_ = (Disposer *)0x0;
      (this->sendingPong).ptr.isSet = true;
      if (local_58 != (uchar *)0x0) {
        local_58 = (uchar *)0x0;
        puStack_50 = (uchar *)0x0;
        (**local_48->_vptr_ArrayDisposer)(local_48,puVar2,1,puVar10,puVar10,0);
      }
    }
  }
  return;
}

Assistant:

void queuePong(kj::Array<byte> payload) {
    if (currentlySending) {
      // There is a message-send in progress, so we cannot write to the stream now.
      //
      // Note: According to spec, if the server receives a second ping before responding to the
      //   previous one, it can opt to respond only to the last ping. So we don't have to check if
      //   queuedPong is already non-null.
      queuedPong = kj::mv(payload);
    } else KJ_IF_MAYBE(promise, sendingPong) {
      // We're still sending a previous pong. Wait for it to finish before sending ours.
      sendingPong = promise->then(kj::mvCapture(payload, [this](kj::Array<byte> payload) mutable {
        return sendPong(kj::mv(payload));
      }));
    } else {
      // We're not sending any pong currently.
      sendingPong = sendPong(kj::mv(payload));
    }